

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

void __thiscall
PruneReplayer::access_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  PruneReplayer *this_01;
  size_type sVar4;
  int *piVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  __node_base_ptr p_Var11;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  PruneReplayer *local_48;
  VkRenderPass local_40;
  Hash local_38;
  
  this_00 = &this->accessed_graphics_pipelines;
  local_38 = hash;
  sVar4 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,&local_38);
  if (sVar4 == 0) {
    local_50 = &this_00->_M_h;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&local_38);
    access_pipeline_layout(this,(Hash)create_info->layout);
    if (create_info->renderPass != (VkRenderPass)0x0) {
      local_50 = &(this->accessed_render_passes)._M_h;
      local_40 = create_info->renderPass;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ();
    }
    local_48 = this;
    if (create_info->stageCount != 0) {
      lVar10 = 0x18;
      uVar9 = 0;
      do {
        local_40 = *(VkRenderPass *)((long)&create_info->pStages->sType + lVar10);
        local_50 = &(this->accessed_shader_modules)._M_h;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->accessed_shader_modules,&local_40,&local_50);
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x30;
      } while (uVar9 < create_info->stageCount);
    }
    this_01 = local_48;
    for (piVar5 = (int *)create_info->pNext; piVar5 != (int *)0x0; piVar5 = *(int **)(piVar5 + 2)) {
      if (*piVar5 == 0x3b9f36d0) goto LAB_0011317f;
    }
    piVar5 = (int *)0x0;
LAB_0011317f:
    if ((piVar5 != (int *)0x0) && (piVar5[4] != 0)) {
      uVar9 = 0;
      do {
        p_Var7 = *(_Hash_node_base **)(*(long *)(piVar5 + 6) + uVar9 * 8);
        uVar1 = (this_01->library_graphics_pipelines)._M_h._M_bucket_count;
        uVar8 = (ulong)p_Var7 % uVar1;
        p_Var2 = (this_01->library_graphics_pipelines)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var2 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var2, p_Var11 = p_Var2->_M_nxt, p_Var2->_M_nxt[1]._M_nxt != p_Var7)) {
          while (p_Var3 = p_Var11->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar8) ||
               (p_Var6 = p_Var11, p_Var11 = p_Var3, p_Var3[1]._M_nxt == p_Var7)) goto LAB_001131fe;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_001131fe:
        if (p_Var6 == (__node_base_ptr)0x0) {
          p_Var7 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var7 = p_Var6->_M_nxt;
        }
        if (p_Var7 != (_Hash_node_base *)0x0) {
          access_graphics_pipeline
                    (this_01,(Hash)p_Var7[1]._M_nxt,(VkGraphicsPipelineCreateInfo *)p_Var7[2]._M_nxt
                    );
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (uint)piVar5[4]);
    }
  }
  return;
}

Assistant:

void access_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info)
	{
		if (accessed_graphics_pipelines.count(hash))
			return;
		accessed_graphics_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		if (create_info->renderPass != VK_NULL_HANDLE)
			accessed_render_passes.insert((Hash) create_info->renderPass);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		auto *library_info =
				find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
				                                           create_info->pNext);

		if (library_info)
		{
			for (uint32_t i = 0; i < library_info->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_graphics_pipelines.find((Hash) library_info->pLibraries[i]);
				if (lib_itr != library_graphics_pipelines.end())
					access_graphics_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}